

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,size_t escapeOffset)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = 0;
  iVar4 = 4;
  while( true ) {
    cVar1 = *is->src_;
    uVar3 = uVar3 * 0x10 + (int)cVar1;
    iVar5 = -0x30;
    if ((((byte)(cVar1 - 0x30U) < 10) || (iVar5 = -0x37, (byte)(cVar1 + 0xbfU) < 6)) ||
       (iVar5 = -0x57, (byte)(cVar1 + 0x9fU) < 6)) {
      uVar3 = uVar3 + iVar5;
      is->src_ = is->src_ + 1;
      bVar2 = true;
    }
    else {
      (this->parseResult_).code_ = kParseErrorStringUnicodeEscapeInvalidHex;
      (this->parseResult_).offset_ = escapeOffset;
      bVar2 = false;
    }
    if (!bVar2) break;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return uVar3;
    }
  }
  return 0;
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset)
  { unsigned codepoint = 0;
    for (int i = 0; i < 4; i++)
    { Ch c = is.Peek();
      codepoint <<= 4;
      codepoint += static_cast<unsigned>(c);
      if (c >= '0' && c <= '9')
        codepoint -= '0';
      else if (c >= 'A' && c <= 'F')
        codepoint -= 'A' - 10;
      else if (c >= 'a' && c <= 'f')
        codepoint -= 'a' - 10;
      else
      { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
      }
      is.Take();
    }
    return codepoint;
  }